

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::Detail::rawMemoryToString_abi_cxx11_
          (string *__return_storage_ptr__,Detail *this,void *object,size_t size)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  ostringstream os;
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [50];
  char acStack_b8 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"0x",2);
  lVar2 = *(long *)(local_198[0] + -0x18);
  if (acStack_b8[lVar2 + 1] == '\0') {
    cVar1 = std::ios::widen((char)local_198 + (char)lVar2);
    acStack_b8[lVar2] = cVar1;
    acStack_b8[lVar2 + 1] = '\x01';
  }
  acStack_b8[lVar2] = '0';
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
  lVar2 = (long)(int)object;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string rawMemoryToString( const void *object, std::size_t size )
    {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>( size ), inc = 1;
        if( Endianness::which() == Endianness::Little ) {
            i = end-1;
            end = inc = -1;
        }

        unsigned char const *bytes = static_cast<unsigned char const *>(object);
        std::ostringstream os;
        os << "0x" << std::setfill('0') << std::hex;
        for( ; i != end; i += inc )
             os << std::setw(2) << static_cast<unsigned>(bytes[i]);
       return os.str();
    }